

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

Point __thiscall MarkerIndex::get_end(MarkerIndex *this,MarkerId id)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false> local_28;
  const_iterator result;
  MarkerId id_local;
  MarkerIndex *this_local;
  
  result.super__Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false>._M_cur
  ._4_4_ = id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
       ::find(&this->end_nodes_by_id,
              (key_type *)
              ((long)&result.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
       ::end(&this->end_nodes_by_id);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    Point::Point((Point *)&this_local);
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false,_false>
                           *)&local_28);
    this_local = (MarkerIndex *)get_node_position(this,pvVar2->second);
  }
  return (Point)this_local;
}

Assistant:

Point MarkerIndex::get_end(MarkerId id) const {
  auto result = end_nodes_by_id.find(id);
  if (result == end_nodes_by_id.end())
    return Point();
  else
    return get_node_position(result->second);
}